

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O0

void xxHash64_test(void *key,int len,uint32_t seed,void *out)

{
  XXH64_hash_t XVar1;
  XXH64_hash_t *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  
  XVar1 = XXH_INLINE_XXH64((void *)CONCAT44(in_ESI,in_EDX),(size_t)in_RCX,0x11460a);
  *in_RCX = XVar1;
  return;
}

Assistant:

inline void xxHash64_test( const void * key, int len, uint32_t seed, void * out ) {
  // objsize 630-7fc + c10-1213: 1999
  *(uint64_t*)out = (uint64_t) XXH64(key, (size_t) len, (unsigned long long) seed);
}